

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cpp
# Opt level: O0

void __thiscall r_exec::_Mem::store(_Mem *this,Code *object)

{
  P<r_code::Code> local_28;
  int64_t local_20;
  int64_t location;
  Code *object_local;
  _Mem *this_local;
  
  location = (int64_t)object;
  object_local = (Code *)this;
  core::P<r_code::Code>::P(&local_28,object);
  r_code::list<core::P<r_code::Code>_>::push_back(&this->objects,&local_28,&local_20);
  core::P<r_code::Code>::~P(&local_28);
  r_code::Code::set_stroage_index((Code *)location,local_20);
  return;
}

Assistant:

void _Mem::store(Code *object)
{
    int64_t location;
    objects.push_back(object, location);
    object->set_stroage_index(location);
}